

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.h
# Opt level: O2

void __thiscall
pbrt::BufferCache<pbrt::Vector3<float>_>::Clear(BufferCache<pbrt::Vector3<float>_> *this)

{
  memory_resource *pmVar1;
  __node_base *p_Var2;
  
  std::mutex::lock(&this->mutex);
  p_Var2 = &(this->cache)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])
              (pmVar1,p_Var2[1]._M_nxt,
               (long)*(_Hash_node_base **)
                      &((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor * 0xc,4);
  }
  std::
  _Hashtable<pbrt::BufferCache<pbrt::Vector3<float>_>::Buffer,_pbrt::BufferCache<pbrt::Vector3<float>_>::Buffer,_std::allocator<pbrt::BufferCache<pbrt::Vector3<float>_>::Buffer>,_std::__detail::_Identity,_std::equal_to<pbrt::BufferCache<pbrt::Vector3<float>_>::Buffer>,_pbrt::BufferCache<pbrt::Vector3<float>_>::BufferHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(this->cache)._M_h);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void Clear() {
        std::lock_guard<std::mutex> lock(mutex);
        for (auto iter : cache)
            alloc.deallocate_object(const_cast<T *>(iter.ptr), iter.size);
        cache.clear();
    }